

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O3

uint8 * google::protobuf::internal::SerializeInternalToArray
                  (uint8 *base,FieldMetadata *field_metadata_table,int32 num_fields,
                  bool is_deterministic,uint8 *buffer)

{
  FieldMetadata *md;
  float fVar1;
  bool bVar2;
  int64 iVar3;
  float *pfVar4;
  undefined1 *puVar5;
  double *pdVar6;
  uint uVar7;
  uint uVar8;
  double *field;
  ulong uVar9;
  uint32 *has_bits_array;
  undefined1 local_c0 [8];
  ArrayOutputStream array_stream;
  CodedOutputStream output;
  undefined1 local_40 [8];
  ArrayOutput array_output;
  
  if (0 < num_fields) {
    uVar9 = 0;
    local_40 = (undefined1  [8])buffer;
    array_output.ptr._0_1_ = is_deterministic;
    do {
      uVar8 = field_metadata_table[uVar9].type;
      if (0x69 < uVar8) {
switchD_0015b09d_caseD_12:
        SerializeNotImplemented(uVar8);
        goto LAB_0015bef8;
      }
      md = field_metadata_table + uVar9;
      field = (double *)(base + md->offset);
      switch(uVar8) {
      case 0:
        if ((*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >> (md->has_offset & 0x1f) & 1) != 0
           ) {
          uVar8 = md->tag;
          if (uVar8 < 0x80) {
LAB_0015be07:
            *(char *)local_40 = (char)uVar8;
            pdVar6 = (double *)((long)local_40 + 1);
          }
          else {
            *(byte *)local_40 = (byte)uVar8 | 0x80;
            uVar7 = uVar8 >> 7;
            if (0x3fff < uVar8) {
              pdVar6 = (double *)((long)local_40 + 2);
              do {
                *(byte *)((long)pdVar6 + -1) = (byte)uVar7 | 0x80;
                uVar8 = uVar7 >> 7;
                pdVar6 = (double *)((long)pdVar6 + 1);
                bVar2 = 0x3fff < uVar7;
                uVar7 = uVar8;
              } while (bVar2);
              goto LAB_0015bebc;
            }
LAB_0015be4e:
            *(char *)((long)local_40 + 1) = (char)uVar7;
            pdVar6 = (double *)((long)local_40 + 2);
          }
LAB_0015bebf:
          *pdVar6 = *field;
          local_40 = (undefined1  [8])(pdVar6 + 1);
        }
        break;
      case 1:
        if ((*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >> (md->has_offset & 0x1f) & 1) != 0
           ) {
          uVar8 = md->tag;
          if (uVar8 < 0x80) {
LAB_0015bcd5:
            *(char *)local_40 = (char)uVar8;
            pfVar4 = (float *)((long)local_40 + 1);
          }
          else {
            *(byte *)local_40 = (byte)uVar8 | 0x80;
            uVar7 = uVar8 >> 7;
            if (0x3fff < uVar8) {
              pfVar4 = (float *)((long)local_40 + 2);
              do {
                *(byte *)((long)pfVar4 + -1) = (byte)uVar7 | 0x80;
                uVar8 = uVar7 >> 7;
                pfVar4 = (float *)((long)pfVar4 + 1);
                bVar2 = 0x3fff < uVar7;
                uVar7 = uVar8;
              } while (bVar2);
              goto LAB_0015bee9;
            }
LAB_0015be6b:
            *(char *)((long)local_40 + 1) = (char)uVar7;
            pfVar4 = (float *)((long)local_40 + 2);
          }
LAB_0015beec:
          *pfVar4 = *(float *)field;
          local_40 = (undefined1  [8])(pfVar4 + 1);
        }
        break;
      case 2:
        if ((*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >> (md->has_offset & 0x1f) & 1) != 0
           ) {
LAB_0015b700:
          SingularFieldHelper<3>::Serialize<google::protobuf::internal::ArrayOutput>
                    (field,md,(ArrayOutput *)local_40);
        }
        break;
      case 3:
        if ((*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >> (md->has_offset & 0x1f) & 1) != 0
           ) {
LAB_0015b816:
          SingularFieldHelper<4>::Serialize<google::protobuf::internal::ArrayOutput>
                    (field,md,(ArrayOutput *)local_40);
        }
        break;
      case 4:
        fVar1 = (float)(*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >>
                        (md->has_offset & 0x1f) & 1);
        goto joined_r0x0015b663;
      case 5:
        if ((*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >> (md->has_offset & 0x1f) & 1) != 0
           ) {
          uVar8 = md->tag;
          if (uVar8 < 0x80) goto LAB_0015be07;
          *(byte *)local_40 = (byte)uVar8 | 0x80;
          uVar7 = uVar8 >> 7;
          if (uVar8 < 0x4000) goto LAB_0015be4e;
          pdVar6 = (double *)((long)local_40 + 2);
          do {
            *(byte *)((long)pdVar6 + -1) = (byte)uVar7 | 0x80;
            uVar8 = uVar7 >> 7;
            pdVar6 = (double *)((long)pdVar6 + 1);
            bVar2 = 0x3fff < uVar7;
            uVar7 = uVar8;
          } while (bVar2);
LAB_0015bebc:
          *(char *)((long)pdVar6 + -1) = (char)uVar8;
          goto LAB_0015bebf;
        }
        break;
      case 6:
        if ((*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >> (md->has_offset & 0x1f) & 1) != 0
           ) {
          uVar8 = md->tag;
          if (uVar8 < 0x80) goto LAB_0015bcd5;
          *(byte *)local_40 = (byte)uVar8 | 0x80;
          uVar7 = uVar8 >> 7;
          if (uVar8 < 0x4000) goto LAB_0015be6b;
          pfVar4 = (float *)((long)local_40 + 2);
          do {
            *(byte *)((long)pfVar4 + -1) = (byte)uVar7 | 0x80;
            uVar8 = uVar7 >> 7;
            pfVar4 = (float *)((long)pfVar4 + 1);
            bVar2 = 0x3fff < uVar7;
            uVar7 = uVar8;
          } while (bVar2);
LAB_0015bee9:
          *(char *)((long)pfVar4 + -1) = (char)uVar8;
          goto LAB_0015beec;
        }
        break;
      case 7:
        if ((*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >> (md->has_offset & 0x1f) & 1) != 0
           ) {
          uVar8 = md->tag;
          if (uVar8 < 0x80) {
LAB_0015b697:
            *(char *)local_40 = (char)uVar8;
            puVar5 = (undefined1 *)((long)local_40 + 1);
          }
          else {
            *(byte *)local_40 = (byte)uVar8 | 0x80;
            uVar7 = uVar8 >> 7;
            if (uVar8 < 0x4000) goto LAB_0015be31;
            puVar5 = (undefined1 *)((long)local_40 + 2);
            do {
              puVar5[-1] = (byte)uVar7 | 0x80;
              uVar8 = uVar7 >> 7;
              puVar5 = puVar5 + 1;
              bVar2 = 0x3fff < uVar7;
              uVar7 = uVar8;
            } while (bVar2);
LAB_0015be92:
            puVar5[-1] = (char)uVar8;
          }
LAB_0015be95:
          *puVar5 = *(undefined1 *)field;
          local_40 = (undefined1  [8])(puVar5 + 1);
        }
        break;
      case 8:
      case 0xb:
        if ((*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >> (md->has_offset & 0x1f) & 1) != 0
           ) {
LAB_0015b0ff:
          SingularFieldHelper<9>::Serialize<google::protobuf::internal::ArrayOutput>
                    (field,md,(ArrayOutput *)local_40);
        }
        break;
      case 9:
        if ((*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >> (md->has_offset & 0x1f) & 1) != 0
           ) {
LAB_0015b6d8:
          SingularFieldHelper<10>::Serialize<google::protobuf::internal::ArrayOutput>
                    (field,md,(ArrayOutput *)local_40);
        }
        break;
      case 10:
        if ((*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >> (md->has_offset & 0x1f) & 1) != 0
           ) {
LAB_0015bd43:
          SingularFieldHelper<11>::Serialize<google::protobuf::internal::ArrayOutput>
                    (field,md,(ArrayOutput *)local_40);
        }
        break;
      case 0xc:
        fVar1 = (float)(*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >>
                        (md->has_offset & 0x1f) & 1);
        goto joined_r0x0015b805;
      case 0xd:
        fVar1 = (float)(*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >>
                        (md->has_offset & 0x1f) & 1);
        goto joined_r0x0015b46d;
      case 0xe:
        if ((*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >> (md->has_offset & 0x1f) & 1) != 0
           ) {
          uVar8 = md->tag;
          if (uVar8 < 0x80) goto LAB_0015bcd5;
          *(byte *)local_40 = (byte)uVar8 | 0x80;
          uVar7 = uVar8 >> 7;
          if (uVar8 < 0x4000) goto LAB_0015be6b;
          pfVar4 = (float *)((long)local_40 + 2);
          do {
            *(byte *)((long)pfVar4 + -1) = (byte)uVar7 | 0x80;
            uVar8 = uVar7 >> 7;
            pfVar4 = (float *)((long)pfVar4 + 1);
            bVar2 = 0x3fff < uVar7;
            uVar7 = uVar8;
          } while (bVar2);
          goto LAB_0015bee9;
        }
        break;
      case 0xf:
        if ((*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >> (md->has_offset & 0x1f) & 1) != 0
           ) {
          uVar8 = md->tag;
          if (uVar8 < 0x80) goto LAB_0015be07;
          *(byte *)local_40 = (byte)uVar8 | 0x80;
          uVar7 = uVar8 >> 7;
          if (uVar8 < 0x4000) goto LAB_0015be4e;
          pdVar6 = (double *)((long)local_40 + 2);
          do {
            *(byte *)((long)pdVar6 + -1) = (byte)uVar7 | 0x80;
            uVar8 = uVar7 >> 7;
            pdVar6 = (double *)((long)pdVar6 + 1);
            bVar2 = 0x3fff < uVar7;
            uVar7 = uVar8;
          } while (bVar2);
          goto LAB_0015bebc;
        }
        break;
      case 0x10:
        fVar1 = (float)(*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >>
                        (md->has_offset & 0x1f) & 1);
        goto joined_r0x0015bd04;
      case 0x11:
        if ((*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >> (md->has_offset & 0x1f) & 1) != 0
           ) {
LAB_0015bc1e:
          SingularFieldHelper<18>::Serialize<google::protobuf::internal::ArrayOutput>
                    (field,md,(ArrayOutput *)local_40);
        }
        break;
      default:
        goto switchD_0015b09d_caseD_12;
      case 0x14:
        if ((*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >> (md->has_offset & 0x1f) & 1) != 0
           ) {
LAB_0015ba9b:
          SingularFieldHelper<21>::Serialize<google::protobuf::internal::ArrayOutput>
                    (field,md,(ArrayOutput *)local_40);
        }
        break;
      case 0x15:
        if ((*field != 0.0) || (NAN(*field))) {
          uVar8 = md->tag;
          if (uVar8 < 0x80) goto LAB_0015be07;
          *(byte *)local_40 = (byte)uVar8 | 0x80;
          uVar7 = uVar8 >> 7;
          if (uVar8 < 0x4000) goto LAB_0015be4e;
          pdVar6 = (double *)((long)local_40 + 2);
          do {
            *(byte *)((long)pdVar6 + -1) = (byte)uVar7 | 0x80;
            uVar8 = uVar7 >> 7;
            pdVar6 = (double *)((long)pdVar6 + 1);
            bVar2 = 0x3fff < uVar7;
            uVar7 = uVar8;
          } while (bVar2);
          goto LAB_0015bebc;
        }
        break;
      case 0x16:
        if ((*(float *)field != 0.0) || (NAN(*(float *)field))) {
          uVar8 = md->tag;
          if (uVar8 < 0x80) goto LAB_0015bcd5;
          *(byte *)local_40 = (byte)uVar8 | 0x80;
          uVar7 = uVar8 >> 7;
          if (uVar8 < 0x4000) goto LAB_0015be6b;
          pfVar4 = (float *)((long)local_40 + 2);
          do {
            *(byte *)((long)pfVar4 + -1) = (byte)uVar7 | 0x80;
            uVar8 = uVar7 >> 7;
            pfVar4 = (float *)((long)pfVar4 + 1);
            bVar2 = 0x3fff < uVar7;
            uVar7 = uVar8;
          } while (bVar2);
          goto LAB_0015bee9;
        }
        break;
      case 0x17:
        if (*field != 0.0) goto LAB_0015b700;
        break;
      case 0x18:
        if (*field != 0.0) goto LAB_0015b816;
        break;
      case 0x19:
        fVar1 = *(float *)field;
joined_r0x0015b663:
        if (fVar1 != 0.0) {
LAB_0015b83e:
          SingularFieldHelper<5>::Serialize<google::protobuf::internal::ArrayOutput>
                    (field,md,(ArrayOutput *)local_40);
        }
        break;
      case 0x1a:
        if (*field != 0.0) {
          uVar8 = md->tag;
          if (uVar8 < 0x80) goto LAB_0015be07;
          *(byte *)local_40 = (byte)uVar8 | 0x80;
          uVar7 = uVar8 >> 7;
          if (uVar8 < 0x4000) goto LAB_0015be4e;
          pdVar6 = (double *)((long)local_40 + 2);
          do {
            *(byte *)((long)pdVar6 + -1) = (byte)uVar7 | 0x80;
            uVar8 = uVar7 >> 7;
            pdVar6 = (double *)((long)pdVar6 + 1);
            bVar2 = 0x3fff < uVar7;
            uVar7 = uVar8;
          } while (bVar2);
          goto LAB_0015bebc;
        }
        break;
      case 0x1b:
        if (*(float *)field != 0.0) {
          uVar8 = md->tag;
          if (uVar8 < 0x80) goto LAB_0015bcd5;
          *(byte *)local_40 = (byte)uVar8 | 0x80;
          uVar7 = uVar8 >> 7;
          if (uVar8 < 0x4000) goto LAB_0015be6b;
          pfVar4 = (float *)((long)local_40 + 2);
          do {
            *(byte *)((long)pfVar4 + -1) = (byte)uVar7 | 0x80;
            uVar8 = uVar7 >> 7;
            pfVar4 = (float *)((long)pfVar4 + 1);
            bVar2 = 0x3fff < uVar7;
            uVar7 = uVar8;
          } while (bVar2);
          goto LAB_0015bee9;
        }
        break;
      case 0x1c:
        if (*(char *)field != '\0') {
          uVar8 = md->tag;
          if (uVar8 < 0x80) goto LAB_0015b697;
          *(byte *)local_40 = (byte)uVar8 | 0x80;
          uVar7 = uVar8 >> 7;
          if (0x3fff < uVar8) {
            puVar5 = (undefined1 *)((long)local_40 + 2);
            do {
              puVar5[-1] = (byte)uVar7 | 0x80;
              uVar8 = uVar7 >> 7;
              puVar5 = puVar5 + 1;
              bVar2 = 0x3fff < uVar7;
              uVar7 = uVar8;
            } while (bVar2);
            goto LAB_0015be92;
          }
LAB_0015be31:
          *(char *)((long)local_40 + 1) = (char)uVar7;
          puVar5 = (undefined1 *)((long)local_40 + 2);
          goto LAB_0015be95;
        }
        break;
      case 0x1d:
      case 0x20:
        if (*(long *)((long)*field + 8) != 0) goto LAB_0015b0ff;
        break;
      case 0x1e:
        if (*field != 0.0) goto LAB_0015b6d8;
        break;
      case 0x1f:
        if (*field != 0.0) goto LAB_0015bd43;
        break;
      case 0x21:
        fVar1 = *(float *)field;
joined_r0x0015b805:
        if (fVar1 != 0.0) {
LAB_0015b866:
          SingularFieldHelper<13>::Serialize<google::protobuf::internal::ArrayOutput>
                    (field,md,(ArrayOutput *)local_40);
        }
        break;
      case 0x22:
        fVar1 = *(float *)field;
joined_r0x0015b46d:
        if (fVar1 != 0.0) {
LAB_0015bb9e:
          SingularFieldHelper<14>::Serialize<google::protobuf::internal::ArrayOutput>
                    (field,md,(ArrayOutput *)local_40);
        }
        break;
      case 0x23:
        if (*(float *)field != 0.0) {
          uVar8 = md->tag;
          if (uVar8 < 0x80) goto LAB_0015bcd5;
          *(byte *)local_40 = (byte)uVar8 | 0x80;
          uVar7 = uVar8 >> 7;
          if (uVar8 < 0x4000) goto LAB_0015be6b;
          pfVar4 = (float *)((long)local_40 + 2);
          do {
            *(byte *)((long)pfVar4 + -1) = (byte)uVar7 | 0x80;
            uVar8 = uVar7 >> 7;
            pfVar4 = (float *)((long)pfVar4 + 1);
            bVar2 = 0x3fff < uVar7;
            uVar7 = uVar8;
          } while (bVar2);
          goto LAB_0015bee9;
        }
        break;
      case 0x24:
        if (*field != 0.0) {
          uVar8 = md->tag;
          if (uVar8 < 0x80) goto LAB_0015be07;
          *(byte *)local_40 = (byte)uVar8 | 0x80;
          uVar7 = uVar8 >> 7;
          if (uVar8 < 0x4000) goto LAB_0015be4e;
          pdVar6 = (double *)((long)local_40 + 2);
          do {
            *(byte *)((long)pdVar6 + -1) = (byte)uVar7 | 0x80;
            uVar8 = uVar7 >> 7;
            pdVar6 = (double *)((long)pdVar6 + 1);
            bVar2 = 0x3fff < uVar7;
            uVar7 = uVar8;
          } while (bVar2);
          goto LAB_0015bebc;
        }
        break;
      case 0x25:
        fVar1 = *(float *)field;
joined_r0x0015bd04:
        if (fVar1 != 0.0) {
LAB_0015bd0a:
          SingularFieldHelper<17>::Serialize<google::protobuf::internal::ArrayOutput>
                    (field,md,(ArrayOutput *)local_40);
        }
        break;
      case 0x26:
        if (*field != 0.0) goto LAB_0015bc1e;
        break;
      case 0x29:
        if (field[1] != 0.0) goto LAB_0015ba9b;
        break;
      case 0x2a:
        RepeatedFieldHelper<1>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)local_40);
        break;
      case 0x2b:
        RepeatedFieldHelper<2>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)local_40);
        break;
      case 0x2c:
        RepeatedFieldHelper<3>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)local_40);
        break;
      case 0x2d:
        RepeatedFieldHelper<4>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)local_40);
        break;
      case 0x2e:
        RepeatedFieldHelper<5>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)local_40);
        break;
      case 0x2f:
        RepeatedFieldHelper<6>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)local_40);
        break;
      case 0x30:
        RepeatedFieldHelper<7>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)local_40);
        break;
      case 0x31:
        RepeatedFieldHelper<8>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)local_40);
        break;
      case 0x32:
      case 0x35:
      case 0x3e:
        RepeatedFieldHelper<9>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)local_40);
        break;
      case 0x33:
        RepeatedFieldHelper<10>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)local_40);
        break;
      case 0x34:
        RepeatedFieldHelper<11>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)local_40);
        break;
      case 0x36:
        RepeatedFieldHelper<13>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)local_40);
        break;
      case 0x37:
        RepeatedFieldHelper<14>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)local_40);
        break;
      case 0x38:
        RepeatedFieldHelper<15>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)local_40);
        break;
      case 0x39:
        RepeatedFieldHelper<16>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)local_40);
        break;
      case 0x3a:
        RepeatedFieldHelper<17>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)local_40);
        break;
      case 0x3b:
        RepeatedFieldHelper<18>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)local_40);
        break;
      case 0x3f:
        PackedFieldHelper<1>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)local_40);
        break;
      case 0x40:
        PackedFieldHelper<2>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)local_40);
        break;
      case 0x41:
        PackedFieldHelper<3>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)local_40);
        break;
      case 0x42:
        PackedFieldHelper<4>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)local_40);
        break;
      case 0x43:
        PackedFieldHelper<5>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)local_40);
        break;
      case 0x44:
        PackedFieldHelper<6>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)local_40);
        break;
      case 0x45:
        PackedFieldHelper<7>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)local_40);
        break;
      case 0x46:
        PackedFieldHelper<8>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)local_40);
        break;
      case 0x47:
      case 0x48:
      case 0x49:
      case 0x4a:
      case 0x53:
        PackedFieldHelper<9>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)local_40);
        break;
      case 0x4b:
        PackedFieldHelper<13>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)local_40);
        break;
      case 0x4c:
        PackedFieldHelper<14>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)local_40);
        break;
      case 0x4d:
        PackedFieldHelper<15>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)local_40);
        break;
      case 0x4e:
        PackedFieldHelper<16>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)local_40);
        break;
      case 0x4f:
        PackedFieldHelper<17>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)local_40);
        break;
      case 0x50:
        PackedFieldHelper<18>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)local_40);
        break;
      case 0x54:
        uVar8 = md->tag;
        if (*(uint *)(base + md->has_offset) == uVar8 >> 3) {
          if (uVar8 < 0x80) goto LAB_0015be07;
          *(byte *)local_40 = (byte)uVar8 | 0x80;
          uVar7 = uVar8 >> 7;
          if (uVar8 < 0x4000) goto LAB_0015be4e;
          pdVar6 = (double *)((long)local_40 + 2);
          do {
            *(byte *)((long)pdVar6 + -1) = (byte)uVar7 | 0x80;
            uVar8 = uVar7 >> 7;
            pdVar6 = (double *)((long)pdVar6 + 1);
            bVar2 = 0x3fff < uVar7;
            uVar7 = uVar8;
          } while (bVar2);
          goto LAB_0015bebc;
        }
        break;
      case 0x55:
        uVar8 = md->tag;
        if (*(uint *)(base + md->has_offset) == uVar8 >> 3) {
          if (uVar8 < 0x80) goto LAB_0015bcd5;
          *(byte *)local_40 = (byte)uVar8 | 0x80;
          uVar7 = uVar8 >> 7;
          if (uVar8 < 0x4000) goto LAB_0015be6b;
          pfVar4 = (float *)((long)local_40 + 2);
          do {
            *(byte *)((long)pfVar4 + -1) = (byte)uVar7 | 0x80;
            uVar8 = uVar7 >> 7;
            pfVar4 = (float *)((long)pfVar4 + 1);
            bVar2 = 0x3fff < uVar7;
            uVar7 = uVar8;
          } while (bVar2);
          goto LAB_0015bee9;
        }
        break;
      case 0x56:
        if (*(uint *)(base + md->has_offset) == md->tag >> 3) goto LAB_0015b700;
        break;
      case 0x57:
        if (*(uint *)(base + md->has_offset) == md->tag >> 3) goto LAB_0015b816;
        break;
      case 0x58:
        if (*(uint *)(base + md->has_offset) != md->tag >> 3) break;
        goto LAB_0015b83e;
      case 0x59:
        uVar8 = md->tag;
        if (*(uint *)(base + md->has_offset) == uVar8 >> 3) {
          if (uVar8 < 0x80) goto LAB_0015be07;
          *(byte *)local_40 = (byte)uVar8 | 0x80;
          uVar7 = uVar8 >> 7;
          if (uVar8 < 0x4000) goto LAB_0015be4e;
          pdVar6 = (double *)((long)local_40 + 2);
          do {
            *(byte *)((long)pdVar6 + -1) = (byte)uVar7 | 0x80;
            uVar8 = uVar7 >> 7;
            pdVar6 = (double *)((long)pdVar6 + 1);
            bVar2 = 0x3fff < uVar7;
            uVar7 = uVar8;
          } while (bVar2);
          goto LAB_0015bebc;
        }
        break;
      case 0x5a:
        uVar8 = md->tag;
        if (*(uint *)(base + md->has_offset) == uVar8 >> 3) {
          if (uVar8 < 0x80) goto LAB_0015bcd5;
          *(byte *)local_40 = (byte)uVar8 | 0x80;
          uVar7 = uVar8 >> 7;
          if (uVar8 < 0x4000) goto LAB_0015be6b;
          pfVar4 = (float *)((long)local_40 + 2);
          do {
            *(byte *)((long)pfVar4 + -1) = (byte)uVar7 | 0x80;
            uVar8 = uVar7 >> 7;
            pfVar4 = (float *)((long)pfVar4 + 1);
            bVar2 = 0x3fff < uVar7;
            uVar7 = uVar8;
          } while (bVar2);
          goto LAB_0015bee9;
        }
        break;
      case 0x5b:
        uVar8 = md->tag;
        if (*(uint *)(base + md->has_offset) == uVar8 >> 3) {
          if (uVar8 < 0x80) goto LAB_0015b697;
          *(byte *)local_40 = (byte)uVar8 | 0x80;
          uVar7 = uVar8 >> 7;
          if (0x3fff < uVar8) {
            puVar5 = (undefined1 *)((long)local_40 + 2);
            do {
              puVar5[-1] = (byte)uVar7 | 0x80;
              uVar8 = uVar7 >> 7;
              puVar5 = puVar5 + 1;
              bVar2 = 0x3fff < uVar7;
              uVar7 = uVar8;
            } while (bVar2);
            goto LAB_0015be92;
          }
          goto LAB_0015be31;
        }
        break;
      case 0x5c:
      case 0x5f:
        if (*(uint *)(base + md->has_offset) == md->tag >> 3) goto LAB_0015b0ff;
        break;
      case 0x5d:
        if (*(uint *)(base + md->has_offset) == md->tag >> 3) goto LAB_0015b6d8;
        break;
      case 0x5e:
        if (*(uint *)(base + md->has_offset) == md->tag >> 3) goto LAB_0015bd43;
        break;
      case 0x60:
        if (*(uint *)(base + md->has_offset) != md->tag >> 3) break;
        goto LAB_0015b866;
      case 0x61:
        if (*(uint *)(base + md->has_offset) != md->tag >> 3) break;
        goto LAB_0015bb9e;
      case 0x62:
        uVar8 = md->tag;
        if (*(uint *)(base + md->has_offset) == uVar8 >> 3) {
          if (uVar8 < 0x80) goto LAB_0015bcd5;
          *(byte *)local_40 = (byte)uVar8 | 0x80;
          uVar7 = uVar8 >> 7;
          if (uVar8 < 0x4000) goto LAB_0015be6b;
          pfVar4 = (float *)((long)local_40 + 2);
          do {
            *(byte *)((long)pfVar4 + -1) = (byte)uVar7 | 0x80;
            uVar8 = uVar7 >> 7;
            pfVar4 = (float *)((long)pfVar4 + 1);
            bVar2 = 0x3fff < uVar7;
            uVar7 = uVar8;
          } while (bVar2);
          goto LAB_0015bee9;
        }
        break;
      case 99:
        uVar8 = md->tag;
        if (*(uint *)(base + md->has_offset) == uVar8 >> 3) {
          if (uVar8 < 0x80) goto LAB_0015be07;
          *(byte *)local_40 = (byte)uVar8 | 0x80;
          uVar7 = uVar8 >> 7;
          if (uVar8 < 0x4000) goto LAB_0015be4e;
          pdVar6 = (double *)((long)local_40 + 2);
          do {
            *(byte *)((long)pdVar6 + -1) = (byte)uVar7 | 0x80;
            uVar8 = uVar7 >> 7;
            pdVar6 = (double *)((long)pdVar6 + 1);
            bVar2 = 0x3fff < uVar7;
            uVar7 = uVar8;
          } while (bVar2);
          goto LAB_0015bebc;
        }
        break;
      case 100:
        if (*(uint *)(base + md->has_offset) != md->tag >> 3) break;
        goto LAB_0015bd0a;
      case 0x65:
        if (*(uint *)(base + md->has_offset) == md->tag >> 3) goto LAB_0015bc1e;
        break;
      case 0x68:
        if (*(uint *)(base + md->has_offset) == md->tag >> 3) {
          field = (double *)*field;
          goto LAB_0015ba9b;
        }
        break;
      case 0x69:
        io::ArrayOutputStream::ArrayOutputStream
                  ((ArrayOutputStream *)local_c0,(void *)local_40,0x7fffffff,-1);
        io::CodedOutputStream::CodedOutputStream
                  ((CodedOutputStream *)&array_stream.position_,(ZeroCopyOutputStream *)local_c0,
                   true);
        (*(code *)md->ptr)(base,md->offset,md->tag,md->has_offset);
        iVar3 = io::EpsCopyOutputStream::ByteCount
                          ((EpsCopyOutputStream *)&array_stream.position_,
                           (uint8 *)output.impl_._56_8_);
        local_40 = (undefined1  [8])((long)local_40 + (long)((int)iVar3 - (int)output.cur_));
        io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)&array_stream.position_);
      }
LAB_0015bef8:
      uVar9 = uVar9 + 1;
      buffer = (uint8 *)local_40;
    } while (uVar9 != (uint)num_fields);
  }
  return (uint8 *)(double *)buffer;
}

Assistant:

uint8* SerializeInternalToArray(const uint8* base,
                                const FieldMetadata* field_metadata_table,
                                int32 num_fields, bool is_deterministic,
                                uint8* buffer) {
  ArrayOutput array_output = {buffer, is_deterministic};
  ArrayOutput* output = &array_output;
  SpecialSerializer func = nullptr;
  for (int i = 0; i < num_fields; i++) {
    const FieldMetadata& field_metadata = field_metadata_table[i];
    const uint8* ptr = base + field_metadata.offset;
    switch (field_metadata.type) {
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_DOUBLE);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_FLOAT);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_INT64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_UINT64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_INT32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_FIXED64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_FIXED32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_BOOL);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_STRING);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_GROUP);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_MESSAGE);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_BYTES);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_UINT32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_ENUM);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SFIXED32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SFIXED64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SINT32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SINT64);
      SERIALIZERS_FOR_TYPE(FieldMetadata::kInlinedType);
      // Special cases
      case FieldMetadata::kSpecial: {
        io::ArrayOutputStream array_stream(array_output.ptr, INT_MAX);
        io::CodedOutputStream output(&array_stream);
        output.SetSerializationDeterministic(is_deterministic);
        func = reinterpret_cast<SpecialSerializer>(
            const_cast<void*>(field_metadata.ptr));
        func(base, field_metadata.offset, field_metadata.tag,
             field_metadata.has_offset, &output);
        array_output.ptr += output.ByteCount();
      } break;
      default:
        // __builtin_unreachable()
        SerializeNotImplemented(field_metadata.type);
    }
  }
  return array_output.ptr;
}